

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

void Abc_SuppTest(int nOnes,int nVars,int fUseSimple,int fCheck,int fVerbose)

{
  uint uVar1;
  abctime aVar2;
  Vec_Wrd_t *p;
  Vec_Wrd_t *p_00;
  abctime aVar3;
  abctime time;
  abctime time_00;
  word Matrix [64];
  word local_238 [65];
  
  aVar2 = Abc_Clock();
  p = Abc_SuppGen(nOnes,nVars);
  if (fUseSimple == 0) {
    p_00 = Abc_SuppGenPairs(p,nVars);
  }
  else {
    p_00 = Abc_SuppGenPairs2(nOnes,nVars);
  }
  if (nVars < 100) {
    printf("M = %2d  N = %2d : ",nOnes,nVars);
    uVar1 = p->nSize;
    printf("K = %6d   ",(ulong)uVar1);
    printf("Total = %12.0f  ",(double)(int)(uVar1 - 1) * (double)(int)uVar1 * 0.5);
    printf("Distinct = %8d  ",(ulong)(uint)p_00->nSize);
    aVar3 = Abc_Clock();
    Abc_PrintTime(0x6e60eb,(char *)(aVar3 - aVar2),time);
    aVar2 = Abc_Clock();
    uVar1 = Abc_SuppMinimize(local_238,p_00,nVars,fVerbose);
    printf("Solution with %d variables found.  ",(ulong)uVar1);
    aVar3 = Abc_Clock();
    Abc_PrintTime(0x736d0a,(char *)(aVar3 - aVar2),time_00);
    if (fCheck != 0) {
      Abc_SuppVerify(p,local_238,nVars,uVar1);
    }
    Vec_WrdFree(p_00);
    Vec_WrdFree(p);
    return;
  }
  __assert_fail("nVars < 100",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilSupp.c"
                ,0x113,"void Abc_SuppTest(int, int, int, int, int)");
}

Assistant:

void Abc_SuppTest( int nOnes, int nVars, int fUseSimple, int fCheck, int fVerbose )
{
    int nVarsMin;
    word Matrix[64];
    abctime clk = Abc_Clock();
    // create the problem
    Vec_Wrd_t * vRes = Abc_SuppGen( nOnes, nVars );
    Vec_Wrd_t * vPairs = fUseSimple ? Abc_SuppGenPairs2( nOnes, nVars ) : Abc_SuppGenPairs( vRes, nVars );
    assert( nVars < 100 );
    printf( "M = %2d  N = %2d : ", nOnes, nVars );
    printf( "K = %6d   ",  Vec_WrdSize(vRes) );
    printf( "Total = %12.0f  ", 0.5 * Vec_WrdSize(vRes) * (Vec_WrdSize(vRes) - 1) );
    printf( "Distinct = %8d  ",  Vec_WrdSize(vPairs) );
    Abc_PrintTime( 1, "Reduction time", Abc_Clock() - clk );
    // solve the problem
    clk = Abc_Clock();
    nVarsMin = Abc_SuppMinimize( Matrix, vPairs, nVars, fVerbose );
    printf( "Solution with %d variables found.  ", nVarsMin );
    Abc_PrintTime( 1, "Covering time", Abc_Clock() - clk );
    if ( fCheck )
        Abc_SuppVerify( vRes, Matrix, nVars, nVarsMin );
    Vec_WrdFree( vPairs );
    Vec_WrdFree( vRes );
}